

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

stringstream * __thiscall
Assimp::JSONWriter::LiteralToString(JSONWriter *this,stringstream *stream,float f)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  long *plVar5;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  if (ABS(f) == INFINITY) {
    if ((this->flags & 2) != 0) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Infinity\"","");
      pcVar4 = "\"";
      if (f < 0.0) {
        pcVar4 = "\"-";
      }
      plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,(ulong)pcVar4);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_50 = *plVar2;
        lStack_48 = plVar1[3];
        plVar5 = &local_50;
      }
      else {
        local_50 = *plVar2;
        plVar5 = (long *)*plVar1;
      }
      lVar3 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(stream + 0x10),(char *)plVar5,lVar3);
      if (plVar5 != &local_50) {
        operator_delete(plVar5,local_50 + 1);
      }
      if (local_40[0] == local_30) {
        return stream;
      }
      operator_delete(local_40[0],local_30[0] + 1);
      return stream;
    }
    pcVar4 = "0.0";
    lVar3 = 3;
  }
  else {
    if (!NAN(f)) {
      std::ostream::_M_insert<double>((double)f);
      return stream;
    }
    if ((this->flags & 2) == 0) {
      pcVar4 = "0.0";
      lVar3 = 3;
    }
    else {
      pcVar4 = "\"NaN\"";
      lVar3 = 5;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(stream + 0x10),pcVar4,lVar3);
  return stream;
}

Assistant:

std::stringstream& LiteralToString(std::stringstream& stream, float f) {
        if (!std::numeric_limits<float>::is_iec559) {
            // on a non IEEE-754 platform, we make no assumptions about the representation or existence
            // of special floating-point numbers. 
            stream << f;
            return stream;
        }

        // JSON does not support writing Inf/Nan
        // [RFC 4672: "Numeric values that cannot be represented as sequences of digits
        // (such as Infinity and NaN) are not permitted."]
        // Nevertheless, many parsers will accept the special keywords Infinity, -Infinity and NaN
        if (std::numeric_limits<float>::infinity() == fabs(f)) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << (f < 0 ? "\"-" : "\"") + std::string("Infinity\"");
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }
        // f!=f is the most reliable test for NaNs that I know of
        else if (f != f) {
            if (flags & Flag_WriteSpecialFloats) {
                stream << "\"NaN\"";
                return stream;
            }
            //  we should print this warning, but we can't - this is called from within a generic assimp exporter, we cannot use cerr
            //	std::cerr << "warning: cannot represent infinite number literal, substituting 0 instead (use -i flag to enforce Infinity/NaN)" << std::endl;
            stream << "0.0";
            return stream;
        }

        stream << f;
        return stream;
    }